

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

MemberSyntax * __thiscall
slang::parsing::Parser::parseMember(Parser *this,SyntaxKind parentKind,bool *anyLocalModules)

{
  SyntaxFactory *this_00;
  BumpAllocator *alloc;
  bool bVar1;
  TokenKind TVar2;
  SyntaxKind SVar3;
  int iVar4;
  HierarchyInstantiationSyntax *pHVar5;
  PortDeclarationSyntax *pPVar6;
  MemberSyntax *pMVar7;
  DPIExportSyntax *pDVar8;
  StatementSyntax *statement;
  ProceduralBlockSyntax *pPVar9;
  UdpDeclarationSyntax *pUVar10;
  CheckerInstantiationSyntax *pCVar11;
  SequenceDeclarationSyntax *pSVar12;
  ImmediateAssertionMemberSyntax *pIVar13;
  TimeUnitsDeclarationSyntax *pTVar14;
  PropertyDeclarationSyntax *pPVar15;
  DPIImportSyntax *pDVar16;
  IfGenerateSyntax *pIVar17;
  GenvarDeclarationSyntax *pGVar18;
  GenerateRegionSyntax *pGVar19;
  LoopGenerateSyntax *pLVar20;
  FunctionDeclarationSyntax *pFVar21;
  ConfigDeclarationSyntax *pCVar22;
  BindDirectiveSyntax *pBVar23;
  CaseGenerateSyntax *pCVar24;
  CheckerDeclarationSyntax *pCVar25;
  ContinuousAssignSyntax *pCVar26;
  DefParamSyntax *pDVar27;
  NetAliasSyntax *pNVar28;
  CovergroupDeclarationSyntax *pCVar29;
  ModportDeclarationSyntax *pMVar30;
  ClassDeclarationSyntax *pCVar31;
  DataDeclarationSyntax *data;
  CheckerDataDeclarationSyntax *pCVar32;
  SpecifyBlockSyntax *pSVar33;
  ConcurrentAssertionStatementSyntax *pCVar34;
  ConcurrentAssertionMemberSyntax *pCVar35;
  SpecparamDeclarationSyntax *pSVar36;
  PrimitiveInstantiationSyntax *pPVar37;
  NamedLabelSyntax *label;
  PackageImportDeclarationSyntax *pPVar38;
  Diagnostic *this_01;
  undefined4 extraout_var;
  SourceLocation SVar39;
  EmptyMemberSyntax *pEVar40;
  uint uVar41;
  __extent_storage<18446744073709551615UL> _Var42;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *src;
  __extent_storage<18446744073709551615UL> extraout_RDX_03;
  TokenKind endKind;
  anon_class_8_1_8991fb9c *in_R8;
  FunctionDeclarationSyntax *unaff_R12;
  uint32_t offset;
  span<slang::parsing::Token,_18446744073709551615UL> qualifiers;
  AttrList attributes;
  Token TVar43;
  SourceRange SVar44;
  Token name;
  Token colon;
  string_view arg;
  Token TVar45;
  Token token;
  Token endgenerate;
  SmallVector<slang::parsing::Token,_4UL> quals;
  Token local_f8;
  SyntaxFactory *local_e8;
  Token local_e0;
  undefined1 local_d0 [8];
  Info *local_c8;
  SyntaxNode *local_c0;
  SyntaxNode *pSStack_b8;
  Info *local_b0;
  AttrList local_a8;
  TokenList local_78;
  Token local_40;
  
  attributes = parseAttributes(this);
  _Var42 = attributes._M_extent._M_extent_value;
  bVar1 = isHierarchyInstantiation(this,false);
  if (bVar1) {
    pHVar5 = parseHierarchyInstantiation(this,attributes);
    return &pHVar5->super_MemberSyntax;
  }
  bVar1 = isPortDeclaration(this,false);
  if (bVar1) {
    pPVar6 = parsePortDeclaration(this,attributes);
    return &pPVar6->super_MemberSyntax;
  }
  bVar1 = isNetDeclaration(this);
  if (bVar1) {
    pMVar7 = parseNetDeclaration(this,attributes);
    return pMVar7;
  }
  bVar1 = isVariableDeclaration(this);
  if (bVar1) {
LAB_00433207:
    pMVar7 = parseVariableDeclaration(this,attributes);
    return pMVar7;
  }
  local_f8 = ParserBase::peek(&this->super_ParserBase);
  TVar2 = local_f8.kind;
  if (ExpectKeyword < TVar2) {
    if (TVar2 < PackageKeyword) {
      if (TVar2 < InitialKeyword) {
        SVar3 = 0x5400bc;
        switch(TVar2) {
        case ExportKeyword:
          TVar43 = ParserBase::peek(&this->super_ParserBase,1);
          if (TVar43.kind == StringLiteral) {
            pDVar8 = parseDPIExport(this,attributes);
            return &pDVar8->super_MemberSyntax;
          }
          pMVar7 = parseExportDeclaration(this,attributes);
          return pMVar7;
        case ExternKeyword:
          errorIfAttributes(this,attributes);
          unaff_R12 = (FunctionDeclarationSyntax *)parseExternMember(this,parentKind,attributes);
          goto LAB_00433c06;
        case FinalKeyword:
          goto switchD_00433274_caseD_a8;
        case ForKeyword:
          pLVar20 = parseLoopGenerateConstruct(this,attributes);
          return &pLVar20->super_MemberSyntax;
        case FunctionKeyword:
          SVar3 = FunctionDeclaration;
          endKind = EndFunctionKeyword;
LAB_00433835:
          pFVar21 = parseFunctionDeclaration
                              (this,attributes,SVar3,endKind,parentKind,
                               (bitmask<slang::parsing::detail::FunctionOptions>)0x0);
          return &pFVar21->super_MemberSyntax;
        case GenerateKeyword:
          errorIfAttributes(this,attributes);
          TVar43 = ParserBase::consume(&this->super_ParserBase);
          Token::Token(&local_e0);
          local_d0 = (undefined1  [8])this;
          local_78.super_span<slang::parsing::Token,_18446744073709551615UL> =
               (span<slang::parsing::Token,_18446744073709551615UL>)
               parseMemberList<slang::syntax::MemberSyntax,slang::parsing::Parser::parseMember(slang::syntax::SyntaxKind,bool&)::__0>
                         (this,(TokenKind)&local_e0,(Token *)local_d0,SVar3,in_R8);
          local_78.super_SyntaxListBase.childCount =
               (size_t)local_78.super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
                       _M_extent_value;
          local_c8 = (Info *)CONCAT44(local_c8._4_4_,SyntaxList);
          local_c0 = (SyntaxNode *)0x0;
          pSStack_b8 = (SyntaxNode *)0x0;
          local_d0 = (undefined1  [8])&PTR_getChild_006a4d30;
          local_78.super_SyntaxListBase.super_SyntaxNode.kind = 1;
          local_78.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
          local_78.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
          local_78.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006a4e20;
          local_b0 = (Info *)_Var42._M_extent_value;
          local_a8 = attributes;
          pGVar19 = slang::syntax::SyntaxFactory::generateRegion
                              (&this->factory,
                               (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_d0,TVar43
                               ,(SyntaxList<slang::syntax::MemberSyntax> *)&local_78,local_e0);
          return &pGVar19->super_MemberSyntax;
        case GenVarKeyword:
          pGVar18 = parseGenvarDeclaration(this,attributes);
          return &pGVar18->super_MemberSyntax;
        case GlobalKeyword:
          goto switchD_00433274_caseD_b3;
        case IfKeyword:
          pIVar17 = parseIfGenerateConstruct(this,attributes);
          return &pIVar17->super_MemberSyntax;
        case ImportKeyword:
          TVar43 = ParserBase::peek(&this->super_ParserBase,1);
          if (TVar43.kind == StringLiteral) {
            pDVar16 = parseDPIImport(this,attributes);
            return &pDVar16->super_MemberSyntax;
          }
          pPVar38 = parseImportDeclaration(this,attributes);
          return &pPVar38->super_MemberSyntax;
        }
      }
      else if (TVar2 < MacromoduleKeyword) {
        if (TVar2 == InitialKeyword) {
          TVar45 = ParserBase::consume(&this->super_ParserBase);
          local_e8 = &this->factory;
          SVar3 = slang::syntax::SyntaxFacts::getProceduralBlockKind(TVar45.kind);
          bVar1 = true;
          goto LAB_00433328;
        }
        if (TVar2 == InterfaceKeyword) {
          TVar43 = ParserBase::peek(&this->super_ParserBase,1);
          if (TVar43.kind == ClassKeyword) goto LAB_00433ac0;
          goto switchD_0043337d_caseD_e8;
        }
      }
      else {
        if (TVar2 == MacromoduleKeyword) {
switchD_0043337d_caseD_e8:
          pMVar7 = parseModule(this,attributes,parentKind,anyLocalModules);
          return pMVar7;
        }
        if (TVar2 == ModPortKeyword) {
          pMVar30 = parseModportDeclaration(this,attributes);
          return &pMVar30->super_MemberSyntax;
        }
        if (TVar2 == ModuleKeyword) goto switchD_0043337d_caseD_e8;
      }
    }
    else if (TVar2 < SpecifyKeyword) {
      if (TVar2 < RandKeyword) {
        switch(TVar2) {
        case PackageKeyword:
        case ProgramKeyword:
          goto switchD_0043337d_caseD_e8;
        case PrimitiveKeyword:
          pUVar10 = parseUdpDeclaration(this,attributes);
          return &pUVar10->super_MemberSyntax;
        case PropertyKeyword:
          pPVar15 = parsePropertyDeclaration(this,attributes);
          return &pPVar15->super_MemberSyntax;
        }
      }
      else {
        if (TVar2 == RandKeyword) {
          TVar43 = ParserBase::consume(&this->super_ParserBase);
          local_c8 = (Info *)CONCAT44(local_c8._4_4_,SyntaxList);
          local_c0 = (SyntaxNode *)0x0;
          pSStack_b8 = (SyntaxNode *)0x0;
          local_d0 = (undefined1  [8])&PTR_getChild_006a4d30;
          local_b0 = (Info *)_Var42._M_extent_value;
          local_a8 = attributes;
          data = parseDataDeclaration(this,(AttrList)ZEXT816(0));
          pCVar32 = slang::syntax::SyntaxFactory::checkerDataDeclaration
                              (&this->factory,
                               (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_d0,TVar43
                               ,data);
          return &pCVar32->super_MemberSyntax;
        }
        if (TVar2 == RestrictKeyword) {
          pCVar34 = parseConcurrentAssertion(this,(NamedLabelSyntax *)0x0,(AttrList)ZEXT816(0));
          goto LAB_00433b97;
        }
        if (TVar2 == SequenceKeyword) {
          pSVar12 = parseSequenceDeclaration(this,attributes);
          return &pSVar12->super_MemberSyntax;
        }
      }
    }
    else if (TVar2 < TimePrecisionKeyword) {
      if (TVar2 == SpecifyKeyword) {
        errorIfAttributes(this,attributes);
        pSVar33 = parseSpecifyBlock(this,attributes);
        return &pSVar33->super_MemberSyntax;
      }
      if (TVar2 == SpecParamKeyword) {
        pSVar36 = parseSpecparam(this,attributes,parentKind);
        return &pSVar36->super_MemberSyntax;
      }
      if (TVar2 == TaskKeyword) {
        SVar3 = TaskDeclaration;
        endKind = EndTaskKeyword;
        goto LAB_00433835;
      }
    }
    else {
      if (TVar2 - 0x12d < 2) {
        errorIfAttributes(this,attributes);
        pTVar14 = parseTimeUnitsDeclaration(this,attributes);
        return &pTVar14->super_MemberSyntax;
      }
      if (TVar2 == VirtualKeyword) {
        TVar43 = ParserBase::peek(&this->super_ParserBase,1);
        if (TVar43.kind == ClassKeyword) {
LAB_00433ac0:
          TVar43 = ParserBase::consume(&this->super_ParserBase);
          pCVar31 = parseClassDeclaration(this,attributes,TVar43);
          return &pCVar31->super_MemberSyntax;
        }
      }
      else if (TVar2 == UnitSystemName) {
        TVar43 = ParserBase::peek(&this->super_ParserBase,1);
        if (((TVar43.kind == DoubleColon) &&
            (TVar43 = ParserBase::peek(&this->super_ParserBase,2), TVar43.kind == Identifier)) &&
           (TVar43 = ParserBase::peek(&this->super_ParserBase,3), TVar43.kind == Identifier)) {
          pCVar11 = parseCheckerInstantiation(this,attributes);
          return &pCVar11->super_MemberSyntax;
        }
        goto LAB_00433207;
      }
    }
    goto switchD_00433274_caseD_a6;
  }
  if (TVar2 < AliasKeyword) {
    if (TVar2 == Identifier) {
      TVar43 = ParserBase::peek(&this->super_ParserBase,1);
      if (TVar43.kind == Colon) {
        TVar43 = ParserBase::peek(&this->super_ParserBase,2);
        uVar41 = TVar43.kind - 100;
        if ((uVar41 < 0x1e) && ((0x20000005U >> (uVar41 & 0x1f) & 1) != 0)) {
          name = ParserBase::consume(&this->super_ParserBase);
          this_00 = &this->factory;
          colon = ParserBase::expect(&this->super_ParserBase,Colon);
          label = slang::syntax::SyntaxFactory::namedLabel(this_00,name,colon);
          pCVar34 = (ConcurrentAssertionStatementSyntax *)
                    parseAssertionStatement(this,label,(AttrList)ZEXT816(0));
          uVar41 = (pCVar34->super_StatementSyntax).super_SyntaxNode.kind - ImmediateAssertStatement
          ;
          if ((uVar41 < 4) && (uVar41 != 1)) {
            local_c8 = (Info *)CONCAT44(local_c8._4_4_,SyntaxList);
            local_c0 = (SyntaxNode *)0x0;
            pSStack_b8 = (SyntaxNode *)0x0;
            local_d0 = (undefined1  [8])&PTR_getChild_006a4d30;
            local_b0 = (Info *)_Var42._M_extent_value;
            local_a8 = attributes;
            unaff_R12 = (FunctionDeclarationSyntax *)
                        slang::syntax::SyntaxFactory::immediateAssertionMember
                                  (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                                           local_d0,(ImmediateAssertionStatementSyntax *)pCVar34);
          }
          else {
            local_c8 = (Info *)CONCAT44(local_c8._4_4_,SyntaxList);
            local_c0 = (SyntaxNode *)0x0;
            pSStack_b8 = (SyntaxNode *)0x0;
            local_d0 = (undefined1  [8])&PTR_getChild_006a4d30;
            local_b0 = (Info *)_Var42._M_extent_value;
            local_a8 = attributes;
            unaff_R12 = (FunctionDeclarationSyntax *)
                        slang::syntax::SyntaxFactory::concurrentAssertionMember
                                  (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                                           local_d0,pCVar34);
          }
        }
        uVar41 = (TVar43._0_4_ & 0xffff) - 100;
        if ((uVar41 < 0x1e) && ((0x20000005U >> (uVar41 & 0x1f) & 1) != 0)) {
          return &unaff_R12->super_MemberSyntax;
        }
      }
      TVar43 = ParserBase::peek(&this->super_ParserBase,1);
      if ((TVar43.kind == Hash) ||
         (TVar43 = ParserBase::peek(&this->super_ParserBase,1), TVar43.kind == OpenParenthesis)) {
        pPVar37 = parsePrimitiveInstantiation(this,attributes);
        return &pPVar37->super_MemberSyntax;
      }
      TVar43 = ParserBase::peek(&this->super_ParserBase,1);
      if (((TVar43.kind == DoubleColon) &&
          (TVar43 = ParserBase::peek(&this->super_ParserBase,2), TVar43.kind == Identifier)) &&
         (TVar43 = ParserBase::peek(&this->super_ParserBase,3), TVar43.kind == Identifier)) {
        pCVar11 = parseCheckerInstantiation(this,attributes);
        return &pCVar11->super_MemberSyntax;
      }
      pMVar7 = parseVariableDeclaration(this,attributes);
      return pMVar7;
    }
    if (TVar2 == SystemIdentifier) {
      unaff_R12 = (FunctionDeclarationSyntax *)parseElabSystemTask(this,attributes);
LAB_00433c06:
      if (unaff_R12 != (FunctionDeclarationSyntax *)0x0) {
        return &unaff_R12->super_MemberSyntax;
      }
    }
    else if (TVar2 == Semicolon) {
      local_c8 = (Info *)CONCAT44(local_c8._4_4_,SyntaxList);
      local_c0 = (SyntaxNode *)0x0;
      pSStack_b8 = (SyntaxNode *)0x0;
      local_d0 = (undefined1  [8])&PTR_getChild_006a4d30;
      local_78.super_SyntaxListBase.super_SyntaxNode.kind = 2;
      local_78.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
      local_78.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
      local_78.super_SyntaxListBase.childCount = 0;
      local_78.super_span<slang::parsing::Token,_18446744073709551615UL> =
           (span<slang::parsing::Token,_18446744073709551615UL>)ZEXT816(0);
      local_78.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006a5330;
      local_b0 = (Info *)_Var42._M_extent_value;
      local_a8 = attributes;
      TVar45 = ParserBase::consume(&this->super_ParserBase);
      goto LAB_00433f84;
    }
    goto switchD_00433274_caseD_a6;
  }
  switch(TVar2) {
  case AliasKeyword:
    pNVar28 = parseNetAlias(this,attributes);
    return &pNVar28->super_MemberSyntax;
  case AlwaysKeyword:
  case AlwaysCombKeyword:
  case AlwaysFFKeyword:
  case AlwaysLatchKeyword:
switchD_00433274_caseD_a8:
    TVar45 = ParserBase::consume(&this->super_ParserBase);
    local_e8 = &this->factory;
    SVar3 = slang::syntax::SyntaxFacts::getProceduralBlockKind(TVar45.kind);
    bVar1 = false;
LAB_00433328:
    local_c8 = (Info *)CONCAT44(local_c8._4_4_,SyntaxList);
    pSStack_b8 = (SyntaxNode *)0x0;
    local_c0 = (SyntaxNode *)0x0;
    local_d0 = (undefined1  [8])&PTR_getChild_006a4d30;
    local_b0 = (Info *)_Var42._M_extent_value;
    local_a8 = attributes;
    statement = parseStatement(this,bVar1,false);
    pPVar9 = slang::syntax::SyntaxFactory::proceduralBlock
                       (local_e8,SVar3,
                        (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_d0,TVar45,
                        statement);
    return &pPVar9->super_MemberSyntax;
  case AssertKeyword:
  case AssumeKeyword:
  case CoverKeyword:
    pCVar34 = (ConcurrentAssertionStatementSyntax *)
              parseAssertionStatement(this,(NamedLabelSyntax *)0x0,(AttrList)ZEXT816(0));
    uVar41 = (pCVar34->super_StatementSyntax).super_SyntaxNode.kind - ImmediateAssertStatement;
    if ((uVar41 < 4) && (uVar41 != 1)) {
      local_c8 = (Info *)CONCAT44(local_c8._4_4_,SyntaxList);
      local_c0 = (SyntaxNode *)0x0;
      pSStack_b8 = (SyntaxNode *)0x0;
      local_d0 = (undefined1  [8])&PTR_getChild_006a4d30;
      local_b0 = (Info *)_Var42._M_extent_value;
      local_a8 = attributes;
      pIVar13 = slang::syntax::SyntaxFactory::immediateAssertionMember
                          (&this->factory,
                           (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_d0,
                           (ImmediateAssertionStatementSyntax *)pCVar34);
      return &pIVar13->super_MemberSyntax;
    }
LAB_00433b97:
    local_c8 = (Info *)CONCAT44(local_c8._4_4_,SyntaxList);
    local_c0 = (SyntaxNode *)0x0;
    pSStack_b8 = (SyntaxNode *)0x0;
    local_d0 = (undefined1  [8])&PTR_getChild_006a4d30;
    local_b0 = (Info *)_Var42._M_extent_value;
    local_a8 = attributes;
    pCVar35 = slang::syntax::SyntaxFactory::concurrentAssertionMember
                        (&this->factory,
                         (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_d0,pCVar34);
    return &pCVar35->super_MemberSyntax;
  case AssignKeyword:
    pCVar26 = parseContinuousAssign(this,attributes);
    return &pCVar26->super_MemberSyntax;
  case BeginKeyword:
    errorIfAttributes(this,attributes);
    if (_Var42._M_extent_value == 0) {
      SVar39 = Token::location(&local_f8);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xc70005,SVar39);
      pMVar7 = parseGenerateBlock(this);
      return pMVar7;
    }
    goto LAB_00433f08;
  case BindKeyword:
    pBVar23 = parseBindDirective(this,attributes);
    return &pBVar23->super_MemberSyntax;
  case CaseKeyword:
    pCVar24 = parseCaseGenerateConstruct(this,attributes);
    return &pCVar24->super_MemberSyntax;
  case CheckerKeyword:
    pCVar25 = parseCheckerDeclaration(this,attributes);
    return &pCVar25->super_MemberSyntax;
  case ClassKeyword:
    Token::Token(&local_40);
    pCVar31 = parseClassDeclaration(this,attributes,local_40);
    return &pCVar31->super_MemberSyntax;
  case ClockingKeyword:
    goto switchD_004332cf_caseD_7a;
  case ConfigKeyword:
    errorIfAttributes(this,attributes);
    pCVar22 = parseConfigDeclaration(this,attributes);
    return &pCVar22->super_MemberSyntax;
  case ConstraintKeyword:
    pMVar7 = parseConstraint(this,attributes,
                             (span<slang::parsing::Token,_18446744073709551615UL>)ZEXT816(0),true);
    return pMVar7;
  case CoverGroupKeyword:
    pCVar29 = parseCovergroupDeclaration(this,attributes,false,false);
    return &pCVar29->super_MemberSyntax;
  case DefaultKeyword:
switchD_00433274_caseD_b3:
    TVar43 = ParserBase::peek(&this->super_ParserBase,1);
    if (TVar43.kind == ClockingKeyword) {
switchD_004332cf_caseD_7a:
      pMVar7 = parseClockingDeclaration(this,attributes);
      return pMVar7;
    }
    TVar43 = ParserBase::peek(&this->super_ParserBase,1);
    if ((TVar43.kind == DisableKeyword) && (local_f8.kind == DefaultKeyword)) {
      pMVar7 = parseDefaultDisable(this,attributes);
      return pMVar7;
    }
    break;
  case DefParamKeyword:
    pDVar27 = parseDefParam(this,attributes);
    return &pDVar27->super_MemberSyntax;
  }
switchD_00433274_caseD_a6:
  bVar1 = slang::syntax::SyntaxFacts::isGateType(local_f8.kind);
  if (bVar1) {
    pPVar37 = parsePrimitiveInstantiation(this,attributes);
    return &pPVar37->super_MemberSyntax;
  }
  bVar1 = slang::syntax::SyntaxFacts::isMethodQualifier(local_f8.kind);
  if (bVar1) {
    Token::Token((Token *)&local_78);
    offset = 0;
    do {
      offset = offset + 1;
      local_78.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase,offset);
      bVar1 = slang::syntax::SyntaxFacts::isMethodQualifier
                        ((TokenKind)local_78.super_SyntaxListBase._vptr_SyntaxListBase);
    } while (bVar1);
    if ((TokenKind)local_78.super_SyntaxListBase._vptr_SyntaxListBase == ConstraintKeyword) {
      local_d0 = (undefined1  [8])&pSStack_b8;
      local_c8 = (Info *)0x0;
      local_c0 = (SyntaxNode *)0x4;
      src = extraout_RDX;
      if (offset != 0) {
        do {
          local_e0 = ParserBase::consume(&this->super_ParserBase);
          SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                    ((SmallVectorBase<slang::parsing::Token> *)local_d0,&local_e0);
          src = extraout_RDX_00;
          if ((local_e0.kind != StaticKeyword) &&
             (bVar1 = slang::syntax::SyntaxFacts::isConstraintQualifier(local_e0.kind),
             src = extraout_RDX_01, bVar1)) {
            SVar44 = Token::range(&local_e0);
            this_01 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xf0005,SVar44);
            arg = Token::valueText(&local_e0);
            Diagnostic::operator<<(this_01,arg);
            src = extraout_RDX_02;
          }
          offset = offset - 1;
        } while (offset != 0);
      }
      iVar4 = SmallVectorBase<slang::parsing::Token>::copy
                        ((SmallVectorBase<slang::parsing::Token> *)local_d0,
                         (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
      qualifiers._M_ptr._4_4_ = extraout_var;
      qualifiers._M_ptr._0_4_ = iVar4;
      qualifiers._M_extent._M_extent_value = extraout_RDX_03._M_extent_value;
      unaff_R12 = (FunctionDeclarationSyntax *)parseConstraint(this,attributes,qualifiers,true);
      if (local_d0 != (undefined1  [8])&pSStack_b8) {
        operator_delete((void *)local_d0);
      }
LAB_00433ef5:
      bVar1 = false;
    }
    else if (((TokenKind)local_78.super_SyntaxListBase._vptr_SyntaxListBase == TaskKeyword) ||
            (bVar1 = true,
            (TokenKind)local_78.super_SyntaxListBase._vptr_SyntaxListBase == FunctionKeyword)) {
      SVar44 = Token::range(&local_f8);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x9b0005,SVar44);
      for (; offset != 0; offset = offset - 1) {
        ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x0);
      }
      SVar3 = TaskDeclaration;
      if ((TokenKind)local_78.super_SyntaxListBase._vptr_SyntaxListBase == FunctionKeyword) {
        SVar3 = FunctionDeclaration;
      }
      TVar2 = slang::syntax::SyntaxFacts::getSkipToKind
                        ((TokenKind)local_78.super_SyntaxListBase._vptr_SyntaxListBase);
      unaff_R12 = parseFunctionDeclaration
                            (this,attributes,SVar3,TVar2,parentKind,
                             (bitmask<slang::parsing::detail::FunctionOptions>)0x0);
      goto LAB_00433ef5;
    }
    if (!bVar1) {
      return &unaff_R12->super_MemberSyntax;
    }
  }
  if (_Var42._M_extent_value == 0) {
    return (MemberSyntax *)0x0;
  }
LAB_00433f08:
  local_c8 = (Info *)CONCAT44(local_c8._4_4_,SyntaxList);
  local_c0 = (SyntaxNode *)0x0;
  pSStack_b8 = (SyntaxNode *)0x0;
  local_d0 = (undefined1  [8])&PTR_getChild_006a4d30;
  local_78.super_SyntaxListBase.super_SyntaxNode.kind = 2;
  local_78.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_78.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_78.super_SyntaxListBase.childCount = 0;
  local_78.super_span<slang::parsing::Token,_18446744073709551615UL> =
       (span<slang::parsing::Token,_18446744073709551615UL>)ZEXT816(0);
  local_78.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006a5330;
  alloc = (this->super_ParserBase).alloc;
  local_b0 = (Info *)_Var42._M_extent_value;
  local_a8 = attributes;
  SVar39 = Token::location(&local_f8);
  TVar45 = Token::createMissing(alloc,Semicolon,SVar39);
LAB_00433f84:
  pEVar40 = slang::syntax::SyntaxFactory::emptyMember
                      (&this->factory,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_d0
                       ,&local_78,TVar45);
  return &pEVar40->super_MemberSyntax;
}

Assistant:

MemberSyntax* Parser::parseMember(SyntaxKind parentKind, bool& anyLocalModules) {
    auto attributes = parseAttributes();

    if (isHierarchyInstantiation(/* requireName */ false))
        return &parseHierarchyInstantiation(attributes);
    if (isPortDeclaration(/* inStatement */ false))
        return &parsePortDeclaration(attributes);
    if (isNetDeclaration())
        return &parseNetDeclaration(attributes);
    if (isVariableDeclaration())
        return &parseVariableDeclaration(attributes);

    Token token = peek();
    switch (token.kind) {
        case TokenKind::GenerateKeyword: {
            errorIfAttributes(attributes);
            auto keyword = consume();

            Token endgenerate;
            auto members = parseMemberList<MemberSyntax>(
                TokenKind::EndGenerateKeyword, endgenerate, SyntaxKind::GenerateRegion,
                [this](SyntaxKind parentKind, bool& anyLocalModules) {
                    return parseMember(parentKind, anyLocalModules);
                });
            return &factory.generateRegion(attributes, keyword, members, endgenerate);
        }
        case TokenKind::BeginKeyword:
            errorIfAttributes(attributes);
            if (!attributes.empty()) {
                return &factory.emptyMember(attributes, nullptr,
                                            Token::createMissing(alloc, TokenKind::Semicolon,
                                                                 token.location()));
            }

            // It's definitely not legal to have a generate block here on its own
            // (without an if or for loop) but some simulators seems to accept it
            // and I've found code in the wild that depends on it. We'll parse it
            // here and then issue a diagnostic about how it's not kosher.
            addDiag(diag::NonStandardGenBlock, token.location());
            return &parseGenerateBlock();
        case TokenKind::TimeUnitKeyword:
        case TokenKind::TimePrecisionKeyword:
            errorIfAttributes(attributes);
            return &parseTimeUnitsDeclaration(attributes);
        case TokenKind::ModuleKeyword:
        case TokenKind::MacromoduleKeyword:
        case TokenKind::ProgramKeyword:
        case TokenKind::PackageKeyword:
            // modules, interfaces, and programs share the same syntax
            return &parseModule(attributes, parentKind, anyLocalModules);
        case TokenKind::InterfaceKeyword:
            // an interface class is different from an interface
            if (peek(1).kind == TokenKind::ClassKeyword)
                return &parseClassDeclaration(attributes, consume());
            else
                return &parseModule(attributes, parentKind, anyLocalModules);
        case TokenKind::ModPortKeyword:
            return &parseModportDeclaration(attributes);
        case TokenKind::BindKeyword:
            return &parseBindDirective(attributes);
        case TokenKind::SpecParamKeyword:
            return &parseSpecparam(attributes, parentKind);
        case TokenKind::AliasKeyword:
            return &parseNetAlias(attributes);
        case TokenKind::SpecifyKeyword:
            errorIfAttributes(attributes);
            return &parseSpecifyBlock(attributes);
        case TokenKind::Identifier:
            if (peek(1).kind == TokenKind::Colon) {
                // Declarations and instantiations have already been handled, so if we reach this
                // point we either have a labeled assertion, or this is some kind of error.
                TokenKind next = peek(2).kind;
                if (next == TokenKind::AssertKeyword || next == TokenKind::AssumeKeyword ||
                    next == TokenKind::CoverKeyword) {

                    auto name = consume();
                    auto& label = factory.namedLabel(name, expect(TokenKind::Colon));
                    auto& statement = parseAssertionStatement(&label, {});
                    switch (statement.kind) {
                        case SyntaxKind::ImmediateAssertStatement:
                        case SyntaxKind::ImmediateAssumeStatement:
                        case SyntaxKind::ImmediateCoverStatement:
                            return &factory.immediateAssertionMember(
                                attributes, statement.as<ImmediateAssertionStatementSyntax>());
                        default:
                            return &factory.concurrentAssertionMember(
                                attributes, statement.as<ConcurrentAssertionStatementSyntax>());
                    }
                }
            }

            // If there's a hash or parenthesis here this is likely a primitive instantiation.
            if (peek(1).kind == TokenKind::Hash || peek(1).kind == TokenKind::OpenParenthesis) {
                return &parsePrimitiveInstantiation(attributes);
            }

            // A double colon could be a package-scoped checker instantiation.
            if (peek(1).kind == TokenKind::DoubleColon && peek(2).kind == TokenKind::Identifier &&
                peek(3).kind == TokenKind::Identifier) {
                return &parseCheckerInstantiation(attributes);
            }

            // Otherwise, assume it's an (erroneous) attempt at a variable declaration.
            return &parseVariableDeclaration(attributes);
        case TokenKind::UnitSystemName: {
            // The only valid thing this can be is a checker instantiation, since
            // variable declarations would have been handled previously. Because these
            // are rare, disambiguate for a bit and then fall back to parsing as a
            // variable decl anyway for a better error message.
            if (peek(1).kind == TokenKind::DoubleColon && peek(2).kind == TokenKind::Identifier &&
                peek(3).kind == TokenKind::Identifier) {
                return &parseCheckerInstantiation(attributes);
            }
            return &parseVariableDeclaration(attributes);
        }
        case TokenKind::AssertKeyword:
        case TokenKind::AssumeKeyword:
        case TokenKind::CoverKeyword: {
            auto& statement = parseAssertionStatement(nullptr, {});
            switch (statement.kind) {
                case SyntaxKind::ImmediateAssertStatement:
                case SyntaxKind::ImmediateAssumeStatement:
                case SyntaxKind::ImmediateCoverStatement:
                    return &factory.immediateAssertionMember(
                        attributes, statement.as<ImmediateAssertionStatementSyntax>());
                default:
                    return &factory.concurrentAssertionMember(
                        attributes, statement.as<ConcurrentAssertionStatementSyntax>());
            }
        }
        case TokenKind::RestrictKeyword: {
            auto& statement = parseConcurrentAssertion(nullptr, {});
            return &factory.concurrentAssertionMember(
                attributes, statement.as<ConcurrentAssertionStatementSyntax>());
        }
        case TokenKind::AssignKeyword:
            return &parseContinuousAssign(attributes);
        case TokenKind::InitialKeyword: {
            auto keyword = consume();
            return &factory.proceduralBlock(getProceduralBlockKind(keyword.kind), attributes,
                                            keyword, parseStatement());
        }
        case TokenKind::FinalKeyword:
        case TokenKind::AlwaysKeyword:
        case TokenKind::AlwaysCombKeyword:
        case TokenKind::AlwaysFFKeyword:
        case TokenKind::AlwaysLatchKeyword: {
            auto keyword = consume();
            return &factory.proceduralBlock(getProceduralBlockKind(keyword.kind), attributes,
                                            keyword, parseStatement(false));
        }
        case TokenKind::ForKeyword:
            return &parseLoopGenerateConstruct(attributes);
        case TokenKind::IfKeyword:
            return &parseIfGenerateConstruct(attributes);
        case TokenKind::CaseKeyword:
            return &parseCaseGenerateConstruct(attributes);
        case TokenKind::GenVarKeyword:
            return &parseGenvarDeclaration(attributes);
        case TokenKind::TaskKeyword:
            return &parseFunctionDeclaration(attributes, SyntaxKind::TaskDeclaration,
                                             TokenKind::EndTaskKeyword, parentKind);
        case TokenKind::FunctionKeyword:
            return &parseFunctionDeclaration(attributes, SyntaxKind::FunctionDeclaration,
                                             TokenKind::EndFunctionKeyword, parentKind);
        case TokenKind::CoverGroupKeyword:
            return &parseCovergroupDeclaration(attributes, /* inClass */ false,
                                               /* hasBaseClass */ false);
        case TokenKind::ClassKeyword:
            return &parseClassDeclaration(attributes, Token());
        case TokenKind::VirtualKeyword:
            if (peek(1).kind == TokenKind::ClassKeyword)
                return &parseClassDeclaration(attributes, consume());
            break;
        case TokenKind::DefParamKeyword:
            return &parseDefParam(attributes);
        case TokenKind::ImportKeyword:
            if (peek(1).kind == TokenKind::StringLiteral) {
                return &parseDPIImport(attributes);
            }
            return &parseImportDeclaration(attributes);
        case TokenKind::ExportKeyword:
            if (peek(1).kind == TokenKind::StringLiteral) {
                return &parseDPIExport(attributes);
            }
            return &parseExportDeclaration(attributes);
        case TokenKind::Semicolon:
            return &factory.emptyMember(attributes, nullptr, consume());
        case TokenKind::PropertyKeyword:
            return &parsePropertyDeclaration(attributes);
        case TokenKind::SequenceKeyword:
            return &parseSequenceDeclaration(attributes);
        case TokenKind::CheckerKeyword:
            return &parseCheckerDeclaration(attributes);
        case TokenKind::GlobalKeyword:
        case TokenKind::DefaultKeyword:
            if (peek(1).kind == TokenKind::ClockingKeyword) {
                return &parseClockingDeclaration(attributes);
            }
            else if (peek(1).kind == TokenKind::DisableKeyword &&
                     token.kind == TokenKind::DefaultKeyword) {
                return &parseDefaultDisable(attributes);
            }
            break;
        case TokenKind::ClockingKeyword:
            return &parseClockingDeclaration(attributes);
        case TokenKind::SystemIdentifier: {
            auto result = parseElabSystemTask(attributes);
            if (result)
                return result;
            break;
        }
        case TokenKind::ConstraintKeyword:
            return &parseConstraint(attributes, {}, true);
        case TokenKind::PrimitiveKeyword:
            return &parseUdpDeclaration(attributes);
        case TokenKind::RandKeyword: {
            auto rand = consume();
            return &factory.checkerDataDeclaration(attributes, rand, parseDataDeclaration({}));
        }
        case TokenKind::ExternKeyword:
            errorIfAttributes(attributes);
            if (auto member = parseExternMember(parentKind, attributes))
                return member;
            break;
        case TokenKind::ConfigKeyword:
            errorIfAttributes(attributes);
            return &parseConfigDeclaration(attributes);
        default:
            break;
    }

    if (isGateType(token.kind))
        return &parsePrimitiveInstantiation(attributes);

    // If this is a class qualifier, maybe they accidentally put them
    // on an out-of-block method definition.
    if (isMethodQualifier(token.kind)) {
        Token t;
        uint32_t index = 0;
        do {
            t = peek(++index);
        } while (isMethodQualifier(t.kind));

        if (t.kind == TokenKind::FunctionKeyword || t.kind == TokenKind::TaskKeyword) {
            // Skip all the qualifiers.
            addDiag(diag::QualifiersOnOutOfBlock, token.range());
            for (uint32_t i = 0; i < index; i++)
                skipToken(std::nullopt);

            auto kind = t.kind == TokenKind::FunctionKeyword ? SyntaxKind::FunctionDeclaration
                                                             : SyntaxKind::TaskDeclaration;
            return &parseFunctionDeclaration(attributes, kind, getSkipToKind(t.kind), parentKind);
        }

        if (t.kind == TokenKind::ConstraintKeyword) {
            // Out-of-block constraints can legitimately have the 'static' keyword,
            // but nothing else.
            SmallVector<Token, 4> quals;
            for (uint32_t i = 0; i < index; i++) {
                Token qual = consume();
                quals.push_back(qual);

                if (qual.kind != TokenKind::StaticKeyword && isConstraintQualifier(qual.kind))
                    addDiag(diag::ConstraintQualOutOfBlock, qual.range()) << qual.valueText();
            }

            return &parseConstraint(attributes, quals.copy(alloc), true);
        }
    }

    // if we got attributes but don't know what comes next, we have some kind of nonsense
    if (!attributes.empty()) {
        return &factory.emptyMember(attributes, nullptr,
                                    Token::createMissing(alloc, TokenKind::Semicolon,
                                                         token.location()));
    }

    // Otherwise, we got nothing and should just return null so that our
    // caller will skip and try again.
    return nullptr;
}